

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::embedRelative
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,ModuleImpl *this,
          StringPtr embedPath)

{
  Impl *pIVar1;
  ReadableDirectory *dir;
  StringPtr pathText;
  char cVar2;
  size_t sVar3;
  ArrayPtr<const_kj::String> local_a8;
  Path local_98;
  ArrayPtr<const_kj::String> local_80 [2];
  ArrayPtr<const_char> local_60;
  Path local_50;
  ArrayPtr<const_kj::String> local_38;
  ModuleImpl *local_28;
  ModuleImpl *this_local;
  StringPtr embedPath_local;
  
  embedPath_local.content.ptr = (char *)embedPath.content.size_;
  this_local = (ModuleImpl *)embedPath.content.ptr;
  local_28 = this;
  embedPath_local.content.size_ = (size_t)__return_storage_ptr__;
  sVar3 = kj::StringPtr::size((StringPtr *)&this_local);
  if ((sVar3 != 0) && (cVar2 = kj::StringPtr::operator[]((StringPtr *)&this_local,0), cVar2 == '/'))
  {
    pIVar1 = this->loader;
    local_60 = (ArrayPtr<const_char>)kj::StringPtr::slice((StringPtr *)&this_local,1);
    kj::Path::parse(&local_50,(StringPtr)local_60);
    kj::PathPtr::PathPtr((PathPtr *)&local_38,&local_50);
    ModuleLoader::Impl::readEmbedFromSearchPath(__return_storage_ptr__,pIVar1,(PathPtr)local_38);
    kj::Path::~Path(&local_50);
    return __return_storage_ptr__;
  }
  pIVar1 = this->loader;
  dir = this->sourceDir;
  local_a8 = (ArrayPtr<const_kj::String>)kj::Path::parent(&this->path);
  pathText.content.size_ = (size_t)embedPath_local.content.ptr;
  pathText.content.ptr = (char *)this_local;
  kj::PathPtr::eval(&local_98,(PathPtr *)&local_a8,pathText);
  kj::PathPtr::PathPtr((PathPtr *)local_80,&local_98);
  ModuleLoader::Impl::readEmbed(__return_storage_ptr__,pIVar1,dir,(PathPtr)local_80[0]);
  kj::Path::~Path(&local_98);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> embedRelative(kj::StringPtr embedPath) override {
    if (embedPath.size() > 0 && embedPath[0] == '/') {
      return loader.readEmbedFromSearchPath(kj::Path::parse(embedPath.slice(1)));
    } else {
      return loader.readEmbed(sourceDir, path.parent().eval(embedPath));
    }
  }